

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall BuildWithDepsLogTestObsoleteDeps::Run(BuildWithDepsLogTestObsoleteDeps *this)

{
  VirtualFileSystem *this_00;
  BuildConfig *config;
  StatusPrinter *status;
  int *piVar1;
  Plan *pPVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  __node_base *p_Var4;
  int iVar5;
  long lVar6;
  Test *pTVar7;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar8;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar9;
  bool bVar10;
  bool condition;
  int iVar11;
  LoadStatus LVar12;
  Node *pNVar13;
  TimeStamp TVar14;
  int iVar15;
  string local_328;
  string err;
  Builder builder;
  State state;
  string local_b0;
  DepsLog deps_log;
  
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  pPVar2 = &builder.plan_;
  builder.state_ = (State *)pPVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"in1","");
  p_Var4 = &state.paths_._M_h._M_before_begin;
  state.paths_._M_h._M_buckets = &p_Var4->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&state,"");
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,(string *)&builder,(string *)&state);
  if ((__node_base *)state.paths_._M_h._M_buckets != p_Var4) {
    operator_delete(state.paths_._M_h._M_buckets,
                    (ulong)((long)&(state.paths_._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if (builder.state_ != (State *)pPVar2) {
    operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
  }
  builder.state_ = (State *)pPVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"in1.d","");
  state.paths_._M_h._M_buckets = &p_Var4->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&state,"out: ","");
  VirtualFileSystem::Create(this_00,(string *)&builder,(string *)&state);
  if ((__node_base *)state.paths_._M_h._M_buckets != p_Var4) {
    operator_delete(state.paths_._M_h._M_buckets,
                    (ulong)((long)&(state.paths_._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if (builder.state_ != (State *)pPVar2) {
    operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
  }
  State::State(&state);
  iVar11 = g_current_test->assertion_failures_;
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&state);
  iVar5 = g_current_test->assertion_failures_;
  iVar15 = iVar5;
  if (iVar11 == iVar5) {
    AssertParse(&state,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                (ManifestParserOptions)0x0);
    pTVar7 = g_current_test;
    iVar15 = g_current_test->assertion_failures_;
    if (iVar5 != iVar15) goto LAB_00138e7d;
    deps_log.file_path_._M_dataplus._M_p = (pointer)&deps_log.file_path_.field_2;
    deps_log.needs_recompaction_ = false;
    deps_log.file_ = (FILE *)0x0;
    deps_log.file_path_._M_string_length = 0;
    deps_log.file_path_.field_2._M_local_buf[0] = '\0';
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    builder.state_ = (State *)&builder.plan_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"ninja_deps","");
    bVar10 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
    bVar10 = testing::Test::Check
                       (pTVar7,bVar10,
                        "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                        ,0x992,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    if (builder.state_ != (State *)&builder.plan_) {
      operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
    }
    pTVar7 = g_current_test;
    if (!bVar10) {
LAB_00138f2f:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      DepsLog::~DepsLog(&deps_log);
      goto LAB_00138e82;
    }
    iVar11 = std::__cxx11::string::compare((char *)&err);
    bVar10 = testing::Test::Check
                       (pTVar7,iVar11 == 0,
                        "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                        ,0x993,"\"\" == err");
    if (!bVar10) goto LAB_00138f2f;
    config = &(this->super_BuildWithDepsLogTest).super_BuildTest.config_;
    status = &(this->super_BuildWithDepsLogTest).super_BuildTest.status_;
    Builder::Builder(&builder,&state,config,(BuildLog *)0x0,&deps_log,&this_00->super_DiskInterface,
                     &status->super_Status,0);
    uVar8._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
         &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_;
    uVar9._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         uVar8._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
         super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
        builder.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
      lVar6 = *(long *)builder.command_runner_._M_t.
                       super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                       super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      builder.command_runner_._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar8._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
           .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      (**(code **)(lVar6 + 8))();
      uVar9._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           builder.command_runner_._M_t.
           super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
           super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    }
    builder.command_runner_._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         uVar9._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
         super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    pTVar7 = g_current_test;
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"out","");
    pNVar13 = Builder::AddTarget(&builder,&local_328,&err);
    testing::Test::Check
              (pTVar7,pNVar13 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x997,"builder.AddTarget(\"out\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = g_current_test;
    iVar11 = std::__cxx11::string::compare((char *)&err);
    bVar10 = testing::Test::Check
                       (pTVar7,iVar11 == 0,
                        "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                        ,0x998,"\"\" == err");
    pTVar7 = g_current_test;
    if (bVar10) {
      condition = Builder::Build(&builder,&err);
      testing::Test::Check
                (pTVar7,condition,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x999,"builder.Build(&err)");
      pTVar7 = g_current_test;
      iVar11 = std::__cxx11::string::compare((char *)&err);
      testing::Test::Check
                (pTVar7,iVar11 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x99a,"\"\" == err");
      DepsLog::Close(&deps_log);
      builder.command_runner_._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
           (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    Builder::~Builder(&builder);
    DepsLog::~DepsLog(&deps_log);
    if (state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    state.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001fda68;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
    ::~_Rb_tree(&state.bindings_.rules_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&state.bindings_.bindings_._M_t);
    if (state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
    ::~_Rb_tree(&state.pools_._M_t);
    std::
    _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&state);
    if (!bVar10) goto LAB_00138efe;
    piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
    *piVar1 = *piVar1 + 1;
    builder.state_ = (State *)&builder.plan_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"in1","");
    state.paths_._M_h._M_buckets = &p_Var4->_M_nxt;
    std::__cxx11::string::_M_construct<char_const*>((string *)&state,"");
    VirtualFileSystem::Create(this_00,(string *)&builder,(string *)&state);
    if ((__node_base *)state.paths_._M_h._M_buckets != p_Var4) {
      operator_delete(state.paths_._M_h._M_buckets,
                      (ulong)((long)&(state.paths_._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (builder.state_ != (State *)&builder.plan_) {
      operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
    }
    builder.state_ = (State *)&builder.plan_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"out","");
    state.paths_._M_h._M_buckets = &p_Var4->_M_nxt;
    std::__cxx11::string::_M_construct<char_const*>((string *)&state,"");
    VirtualFileSystem::Create(this_00,(string *)&builder,(string *)&state);
    if ((__node_base *)state.paths_._M_h._M_buckets != p_Var4) {
      operator_delete(state.paths_._M_h._M_buckets,
                      (ulong)((long)&(state.paths_._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (builder.state_ != (State *)&builder.plan_) {
      operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
    }
    pTVar7 = g_current_test;
    builder.state_ = (State *)&builder.plan_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"in1.d","");
    TVar14 = VirtualFileSystem::Stat(this_00,(string *)&builder,&err);
    testing::Test::Check
              (pTVar7,TVar14 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x9a7,"0 == fs_.Stat(\"in1.d\", &err)");
    if (builder.state_ != (State *)&builder.plan_) {
      operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
    }
    State::State(&state);
    iVar11 = g_current_test->assertion_failures_;
    StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&state);
    iVar5 = g_current_test->assertion_failures_;
    if (iVar11 == iVar5) {
      AssertParse(&state,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                  (ManifestParserOptions)0x0);
      pTVar7 = g_current_test;
      if (iVar5 == g_current_test->assertion_failures_) {
        deps_log.needs_recompaction_ = false;
        deps_log.file_ = (FILE *)0x0;
        deps_log.file_path_._M_dataplus._M_p = (pointer)&deps_log.file_path_.field_2;
        deps_log.file_path_._M_string_length = 0;
        deps_log.file_path_.field_2._M_local_buf[0] = '\0';
        deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        builder.state_ = (State *)&builder.plan_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"ninja_deps","");
        LVar12 = DepsLog::Load(&deps_log,(string *)&builder,&state,&err);
        bVar10 = testing::Test::Check
                           (pTVar7,LVar12 != LOAD_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                            ,0x9af,"deps_log.Load(\"ninja_deps\", &state, &err)");
        if (builder.state_ != (State *)&builder.plan_) {
          operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
        }
        pTVar7 = g_current_test;
        if (bVar10) {
          builder.state_ = (State *)&builder.plan_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"ninja_deps","");
          bVar10 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
          bVar10 = testing::Test::Check
                             (pTVar7,bVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                              ,0x9b0,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
          if (builder.state_ != (State *)&builder.plan_) {
            operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
          }
          if (bVar10) {
            Builder::Builder(&builder,&state,config,(BuildLog *)0x0,&deps_log,
                             &this_00->super_DiskInterface,&status->super_Status,0);
            paVar3 = &local_328.field_2;
            if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
                builder.command_runner_._M_t.
                super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
              lVar6 = *(long *)builder.command_runner_._M_t.
                               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                               .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
              builder.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   uVar8._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
              (**(code **)(lVar6 + 8))();
              uVar8._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
              _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   builder.command_runner_._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            }
            builder.command_runner_._M_t.
            super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
            super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 uVar8._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_at_end(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_,
                              (this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                              commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            pTVar7 = g_current_test;
            local_328._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"out","");
            pNVar13 = Builder::AddTarget(&builder,&local_328,&err);
            testing::Test::Check
                      (pTVar7,pNVar13 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x9b5,"builder.AddTarget(\"out\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != paVar3) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar7 = g_current_test;
            iVar11 = std::__cxx11::string::compare((char *)&err);
            bVar10 = testing::Test::Check
                               (pTVar7,iVar11 == 0,
                                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                ,0x9b6,"\"\" == err");
            if (bVar10) {
              local_328._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"in1.d","");
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"out: ","");
              VirtualFileSystem::Create(this_00,&local_328,&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != paVar3) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              pTVar7 = g_current_test;
              bVar10 = Builder::Build(&builder,&err);
              testing::Test::Check
                        (pTVar7,bVar10,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x9bb,"builder.Build(&err)");
              pTVar7 = g_current_test;
              iVar11 = std::__cxx11::string::compare((char *)&err);
              testing::Test::Check
                        (pTVar7,iVar11 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x9bc,"\"\" == err");
              testing::Test::Check
                        (g_current_test,
                         (long)*(pointer *)
                                ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                        command_runner_.commands_ran_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                         (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start == 0x20,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x9c0,"1u == command_runner_.commands_ran_.size()");
              builder.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
                   (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
            }
            else {
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            }
            Builder::~Builder(&builder);
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
        DepsLog::~DepsLog(&deps_log);
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
      g_current_test->assertion_failures_ = iVar5 + 1;
    }
    if (state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_00138e7d:
    g_current_test->assertion_failures_ = iVar15 + 1;
LAB_00138e82:
    if (state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  state.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001fda68;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&state.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&state.bindings_.bindings_._M_t);
  if (state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&state.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&state);
LAB_00138efe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err._M_dataplus._M_p != &err.field_2) {
    operator_delete(err._M_dataplus._M_p,
                    CONCAT71(err.field_2._M_allocated_capacity._1_7_,err.field_2._M_local_buf[0]) +
                    1);
  }
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, ObsoleteDeps) {
  string err;
  // Note: in1 was created by the superclass SetUp().
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";
  {
    // Run an ordinary build that gathers dependencies.
    fs_.Create("in1", "");
    fs_.Create("in1.d", "out: ");

    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    deps_log.Close();
    builder.command_runner_.release();
  }

  // Push all files one tick forward so that only the deps are out
  // of date.
  fs_.Tick();
  fs_.Create("in1", "");
  fs_.Create("out", "");

  // The deps file should have been removed, so no need to timestamp it.
  EXPECT_EQ(0, fs_.Stat("in1.d", &err));

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));

    Builder builder(&state, config_, NULL, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    command_runner_.commands_ran_.clear();
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);

    // Recreate the deps file here because the build expects them to exist.
    fs_.Create("in1.d", "out: ");

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // We should have rebuilt the output due to the deps being
    // out of date.
    EXPECT_EQ(1u, command_runner_.commands_ran_.size());

    builder.command_runner_.release();
  }
}